

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O3

void free_mmdb_struct(MMDB_s *mmdb)

{
  char *__ptr;
  MMDB_description_s **ppMVar1;
  char **__ptr_00;
  MMDB_description_s *__ptr_01;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  
  if (mmdb != (MMDB_s *)0x0) {
    if (mmdb->filename != (char *)0x0) {
      free(mmdb->filename);
      mmdb->filename = (char *)0x0;
    }
    if (mmdb->file_content != (uint8_t *)0x0) {
      munmap(mmdb->file_content,mmdb->file_size);
    }
    __ptr = (mmdb->metadata).database_type;
    if (__ptr != (char *)0x0) {
      free(__ptr);
      (mmdb->metadata).database_type = (char *)0x0;
    }
    __ptr_00 = (mmdb->metadata).languages.names;
    if (__ptr_00 != (char **)0x0) {
      if ((mmdb->metadata).languages.count != 0) {
        uVar2 = 0;
        do {
          free((mmdb->metadata).languages.names[uVar2]);
          (mmdb->metadata).languages.names[uVar2] = (char *)0x0;
          uVar2 = uVar2 + 1;
        } while (uVar2 < (mmdb->metadata).languages.count);
        __ptr_00 = (mmdb->metadata).languages.names;
      }
      free(__ptr_00);
      (mmdb->metadata).languages.names = (char **)0x0;
    }
    uVar2 = (mmdb->metadata).description.count;
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        __ptr_01 = (mmdb->metadata).description.descriptions[uVar3];
        if (__ptr_01 != (MMDB_description_s *)0x0) {
          if (__ptr_01->language != (char *)0x0) {
            free(__ptr_01->language);
            ppMVar1 = (mmdb->metadata).description.descriptions;
            ppMVar1[uVar3]->language = (char *)0x0;
            __ptr_01 = ppMVar1[uVar3];
          }
          if (__ptr_01->description != (char *)0x0) {
            free(__ptr_01->description);
            ppMVar1 = (mmdb->metadata).description.descriptions;
            ppMVar1[uVar3]->description = (char *)0x0;
            __ptr_01 = ppMVar1[uVar3];
          }
          free(__ptr_01);
          (mmdb->metadata).description.descriptions[uVar3] = (MMDB_description_s *)0x0;
          uVar2 = (mmdb->metadata).description.count;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar2);
      free((mmdb->metadata).description.descriptions);
      (mmdb->metadata).description.descriptions = (MMDB_description_s **)0x0;
    }
  }
  return;
}

Assistant:

static void free_mmdb_struct(MMDB_s *const mmdb) {
    if (!mmdb) {
        return;
    }

    if (NULL != mmdb->filename) {
#if defined(__clang__)
// This is a const char * that we need to free, which isn't valid. However it
// would mean changing the public API to fix this.
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wcast-qual"
#endif
        FREE_AND_SET_NULL(mmdb->filename);
#if defined(__clang__)
#pragma clang diagnostic pop
#endif
    }
    if (NULL != mmdb->file_content) {
#ifdef _WIN32
        UnmapViewOfFile(mmdb->file_content);
        /* Winsock is only initialized if open was successful so we only have
         * to cleanup then. */
        WSACleanup();
#else
#if defined(__clang__)
// This is a const char * that we need to free, which isn't valid. However it
// would mean changing the public API to fix this.
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wcast-qual"
#endif
        munmap((void *)mmdb->file_content, (size_t)mmdb->file_size);
#if defined(__clang__)
#pragma clang diagnostic pop
#endif
#endif
    }

    if (NULL != mmdb->metadata.database_type) {
#if defined(__clang__)
// This is a const char * that we need to free, which isn't valid. However it
// would mean changing the public API to fix this.
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wcast-qual"
#endif
        FREE_AND_SET_NULL(mmdb->metadata.database_type);
#if defined(__clang__)
#pragma clang diagnostic pop
#endif
    }

    free_languages_metadata(mmdb);
    free_descriptions_metadata(mmdb);
}